

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O1

MemChunk * __thiscall
cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::arenaAlloc
          (MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *this,size_type chunkSize
          )

{
  SmallMemChunk *chunk;
  SmallMemChunk *pSVar1;
  SmallMemChunk *pSVar2;
  SmallMemChunk *curr;
  ulong uVar3;
  MemSegment *pMVar4;
  uint uVar5;
  ulong uVar6;
  size_type *psVar7;
  
  uVar3 = chunkSize + 0x18;
  if ((chunkSize < 0xffffffffffffffe8) &&
     ((this->m_footprintLimit == 0 ||
      (uVar6 = this->m_footprint + uVar3,
      uVar6 <= this->m_footprintLimit && this->m_footprint < uVar6)))) {
    uVar6 = this->m_arena->m_minSize;
    if (uVar6 < uVar3) {
      uVar6 = uVar3;
    }
    pMVar4 = (MemSegment *)malloc(uVar6);
    if (pMVar4 != (MemSegment *)0x0) {
      uVar3 = this->m_footprint + uVar6;
      this->m_footprint = uVar3;
      if (this->m_maxFootprint < uVar3) {
        this->m_maxFootprint = uVar3;
      }
      pMVar4->m_size = uVar6;
      pMVar4->m_pad = 1;
      pMVar4[1].m_size = uVar6 - 0x18;
      *(ulong *)((long)pMVar4 + (uVar6 - 8)) = uVar6 - 0x18;
      if (this->m_segList == (MemSegment *)0x0) {
        this->m_segList = pMVar4;
        pMVar4->m_next = (MemSegment *)0x0;
        this->m_release_checks = 0xfff;
      }
      else {
        pMVar4->m_next = this->m_segList;
        this->m_segList = pMVar4;
      }
      psVar7 = &pMVar4->m_pad;
      uVar6 = pMVar4[1].m_size & 0xfffffffffffffff0;
      uVar3 = uVar6 - chunkSize;
      if (uVar3 < 0x20) {
        return (MemChunk *)psVar7;
      }
      chunk = (SmallMemChunk *)((long)psVar7 + chunkSize);
      pMVar4[1].m_size = chunkSize;
      *(size_type *)((long)&pMVar4->m_pad + chunkSize) = chunkSize;
      *(ulong *)((long)&pMVar4[1].m_size + chunkSize) = uVar3;
      *(ulong *)((long)&pMVar4->m_pad + uVar6) = uVar3;
      if (0xff < uVar3) {
        addLargeChunk(this,(MemChunk *)chunk);
        return (MemChunk *)psVar7;
      }
      uVar5 = (uint)(uVar3 >> 3) & 0x1e;
      pSVar1 = this->m_smallLists[uVar5].m_head;
      if (pSVar1 == (SmallMemChunk *)0x0) {
        chunk->next = chunk;
        chunk->prev = chunk;
        this->m_smallLists[uVar5].m_head = chunk;
      }
      else {
        pSVar2 = pSVar1->next;
        pSVar1->next = chunk;
        pSVar2->prev = chunk;
        chunk->next = pSVar2;
        chunk->prev = pSVar1;
      }
      if ((this->m_smallMap >> uVar5 & 1) != 0) {
        return (MemChunk *)psVar7;
      }
      this->m_smallMap = this->m_smallMap | 1 << (sbyte)uVar5;
      return (MemChunk *)psVar7;
    }
  }
  return (MemChunk *)0x0;
}

Assistant:

MemChunk*
    arenaAlloc (size_type chunkSize)
    {
        size_type estSize;             /* allocation size */

        estSize = chunkSize + SEGMENT_OVERHEAD;
        if (estSize <= chunkSize)
        {
            // Technically can never reach here due to the MAX_REQUEST value
            //
            // However it is always good to have a check.
            return nullptr;
        }

        /*
         * Check user specified foot print limit
         */
        if (m_footprintLimit != 0)
        {
            size_type fp = m_footprint + estSize;
            if (fp <= m_footprint || fp > m_footprintLimit)
            {
                return nullptr;
            }
        }

        /*
         * Request memory segments from arena.
         */
        size_type segSize = estSize;
        MemSegment* seg = (MemSegment*)m_arena.getSegment (segSize);
        m_logger.logGetSegment (seg, segSize);

        /*
         * Initialize the segment obtained.
         */
        if (seg)
        {

            if ((m_footprint += segSize) > m_maxFootprint)
            {
                m_maxFootprint = m_footprint;
            }

            MemChunk* chunk = seg->init (segSize);

            if (m_segList == nullptr)
            {
                m_segList = seg;
                seg->setNext (nullptr);

                m_release_checks = MAX_RELEASE_CHECK_RATE;
            }
            else
            {
                seg->setNext (m_segList);
                m_segList = seg;
            }

            return splitChunk (chunk, chunkSize);
        }
        return nullptr;
    }